

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase436::run(TestCase436 *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  OwnPromiseNode OVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar3;
  void *pvVar4;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:451:23)>
  *location_01;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:498:23)>
  *location_02;
  OwnPromiseNode local_1a0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_198;
  void *continuationTracePtr;
  OwnPromiseNode intermediate;
  int counter;
  OwnPromiseNode local_178;
  DebugComparison<int,_int_&> _kjCondition;
  anon_class_8_1_bc7188dc_for_func local_148;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_140;
  char *local_138;
  char *pcStack_130;
  undefined8 local_128;
  char *local_120;
  char *pcStack_118;
  undefined8 local_110;
  WaitScope waitScope;
  ErrorHandlerImpl errorHandler;
  TaskSet tasks;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  counter = 0;
  errorHandler.super_ErrorHandler._vptr_ErrorHandler = (ErrorHandler)&PTR_Exception____00578828;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_118 = "run";
  local_110 = 0xf000001c1;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x1c1;
  location.columnNumber = 0xf;
  TaskSet::TaskSet(&tasks,&errorHandler.super_ErrorHandler,location);
  _kjCondition._0_8_ = &counter;
  _kjCondition.right = (int *)&tasks;
  yield();
  OVar3.ptr = local_198.ptr;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:451:23)>
       ::anon_class_16_2_219bd73b_for_func::operator();
  pPVar1 = ((local_198.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_198.ptr - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:451:23)>
                   *)((long)pvVar4 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase436::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase436::run()::__0,void*&>
              (location_01,&local_198,(anon_class_16_2_219bd73b_for_func *)&_kjCondition,
               &continuationTracePtr);
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    ((local_198.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:451:23)>
                   *)(local_198.ptr + -3);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase436::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase436::run()::__0,void*&>
              (location_01,&local_198,(anon_class_16_2_219bd73b_for_func *)&_kjCondition,
               &continuationTracePtr);
    OVar3.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  intermediate.ptr = (PromiseNode *)0x0;
  local_140.ptr = (PromiseNode *)0x0;
  local_1a0.ptr = (PromiseNode *)location_01;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_198);
  TaskSet::add(&tasks,(Promise<void> *)&local_1a0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1a0);
  local_148.counter = &counter;
  yield();
  OVar2.ptr = local_1a0.ptr;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:498:23)>
       ::anon_class_8_1_bc7188dc_for_func::operator();
  pPVar1 = (((TransformPromiseNodeBase *)&(local_1a0.ptr)->super_PromiseArenaMember)->
           super_PromiseNode).super_PromiseArenaMember.arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_1a0.ptr - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    location_02 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:498:23)>
                   *)((long)pvVar4 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase436::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase436::run()::__1,void*&>
              (location_02,&local_1a0,&local_148,&continuationTracePtr);
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    (((TransformPromiseNodeBase *)&(local_1a0.ptr)->super_PromiseArenaMember)->super_PromiseNode).
    super_PromiseArenaMember.arena = (PromiseArena *)0x0;
    location_02 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:498:23)>
                   *)&(((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:451:23)>
                         *)(local_1a0.ptr + -3))->super_TransformPromiseNodeBase).super_PromiseNode.
                      super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase436::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase436::run()::__1,void*&>
              (location_02,&local_1a0,&local_148,&continuationTracePtr);
    ((OwnPromiseNode *)(OVar2.ptr + -2))->ptr = (PromiseNode *)pPVar1;
  }
  _kjCondition._0_8_ = &DAT_003d3151;
  _kjCondition.right = (int *)&DAT_003d31b0;
  _kjCondition.op.content.ptr = (char *)0x4c0000058b;
  location_00.function = &DAT_003d31b0;
  location_00.fileName = &DAT_003d3151;
  location_00.lineNumber = 0x58b;
  location_00.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_02;
  kj::_::maybeChain<void>(&local_198,(Promise<void> *)&intermediate,location_00);
  OVar3.ptr = local_198.ptr;
  local_198.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_198);
  local_178.ptr = OVar3.ptr;
  local_140.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1a0);
  TaskSet::add(&tasks,(Promise<void> *)&local_178);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_178);
  TaskSet::onEmpty((TaskSet *)&_kjCondition);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_130 = "run";
  local_128 = 0x3000001fa;
  Promise<void>::wait((Promise<void> *)&_kjCondition,&waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  _kjCondition.result = counter == 0xb;
  _kjCondition.left = 0xb;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.right = &counter;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    continuationTracePtr = (void *)CONCAT44(continuationTracePtr._4_4_,0xb);
    kj::_::Debug::log<char_const(&)[35],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1fc,ERROR,"\"failed: expected \" \"(11) == (counter)\", _kjCondition, 11, counter"
               ,(char (*) [35])"failed: expected (11) == (counter)",&_kjCondition,
               (int *)&continuationTracePtr,&counter);
  }
  TaskSet::~TaskSet(&tasks);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, Ordering) {
  EventLoop loop;
  WaitScope waitScope(loop);

  class ErrorHandlerImpl: public TaskSet::ErrorHandler {
  public:
    void taskFailed(kj::Exception&& exception) override {
      KJ_FAIL_EXPECT(exception);
    }
  };

  int counter = 0;
  ErrorHandlerImpl errorHandler;
  kj::TaskSet tasks(errorHandler);

  tasks.add(evalLater([&]() {
    EXPECT_EQ(0, counter++);

    {
      // Use a promise and fulfiller so that we can fulfill the promise after waiting on it in
      // order to induce depth-first scheduling.
      auto paf = kj::newPromiseAndFulfiller<void>();
      tasks.add(paf.promise.then([&]() {
        EXPECT_EQ(1, counter++);
      }));
      paf.fulfiller->fulfill();
    }

    // .then() is scheduled breadth-first if the promise has already resolved, but depth-first
    // if the promise resolves later.
    tasks.add(Promise<void>(READY_NOW).then([&]() {
      EXPECT_EQ(4, counter++);
    }).then([&]() {
      EXPECT_EQ(5, counter++);
      tasks.add(kj::evalLast([&]() {
        EXPECT_EQ(7, counter++);
        tasks.add(kj::evalLater([&]() {
          EXPECT_EQ(8, counter++);
        }));
      }));
    }));

    {
      auto paf = kj::newPromiseAndFulfiller<void>();
      tasks.add(paf.promise.then([&]() {
        EXPECT_EQ(2, counter++);
        tasks.add(kj::evalLast([&]() {
          EXPECT_EQ(9, counter++);
          tasks.add(kj::evalLater([&]() {
            EXPECT_EQ(10, counter++);
          }));
        }));
      }));
      paf.fulfiller->fulfill();
    }

    // evalLater() is like READY_NOW.then().
    tasks.add(evalLater([&]() {
      EXPECT_EQ(6, counter++);
    }));
  }));

  tasks.add(evalLater([&]() {
    EXPECT_EQ(3, counter++);

    // Making this a chain should NOT cause it to preempt the first promise.  (This was a problem
    // at one point.)
    return Promise<void>(READY_NOW);
  }));

  tasks.onEmpty().wait(waitScope);

  EXPECT_EQ(11, counter);
}